

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5a7ffb::LHashTest_Basic_Test::TestBody(LHashTest_Basic_Test *this)

{
  undefined8 __p;
  int iVar1;
  uint32_t key_hash;
  tuple<(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char> lh_00;
  _Base_ptr p_Var2;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> *this_00;
  pointer *__ptr;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var3;
  char *pcVar4;
  char *in_R9;
  uint uVar5;
  char *previous;
  AssertionResult gtest_ar_1;
  AssertHelper local_c0;
  ValueList actual;
  AssertionResult gtest_ar_;
  AssertHelper local_70;
  unique_ptr<(anonymous_namespace)::lhash_st_char,_(anonymous_namespace)::FreeLHASH_OF_char> lh;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
  dummy_lh;
  
  lh_00.
  super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
  .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
        )OPENSSL_lh_new(OPENSSL_strhash,strcmp);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       lh_00.
       super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
       .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>._M_head_impl !=
       (_Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>)0x0;
  lh._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::lhash_st_char,_(anonymous_namespace)::FreeLHASH_OF_char>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
  .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::lhash_st_char,_(anonymous_namespace)::FreeLHASH_OF_char,_true,_true>
        )(__uniq_ptr_data<(anonymous_namespace)::lhash_st_char,_(anonymous_namespace)::FreeLHASH_OF_char,_true,_true>
          )lh_00.
           super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
           .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>._M_head_impl;
  if (lh_00.
      super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
      .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>._M_head_impl ==
      (_Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>)0x0) {
    testing::Message::Message((Message *)&actual);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&dummy_lh,(internal *)&gtest_ar_,(AssertionResult *)"lh","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
               ,0x42,(char *)dummy_lh._M_t._M_impl._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&actual);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&dummy_lh);
    if (actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    dummy_lh._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &dummy_lh._M_t._M_impl.super__Rb_tree_header._M_header;
    dummy_lh._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    dummy_lh._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    dummy_lh._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    dummy_lh._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         dummy_lh._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar5 = 0; uVar5 != 100000; uVar5 = uVar5 + 1) {
      actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)dummy_lh._M_t._M_impl.super__Rb_tree_header._M_node_count;
      gtest_ar_1._0_8_ =
           OPENSSL_lh_num_items
                     ((_LHASH *)
                      lh_00.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
                      .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>.
                      _M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_,"dummy_lh.size()","lh_char_num_items(lh.get())",
                 (unsigned_long *)&actual,(unsigned_long *)&gtest_ar_1);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&actual);
        pcVar4 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                   ,0x4a,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&actual);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
        if (actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(*actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      if (uVar5 % 1000 == 0) {
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (p_Var2 = dummy_lh._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var2 != &dummy_lh._M_t._M_impl.super__Rb_tree_header;
            p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
          gtest_ar_1._0_8_ = *(undefined8 *)(p_Var2 + 2);
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&gtest_ar_,
                     (char **)&gtest_ar_1);
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (gtest_ar_._0_8_,
                   gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
        gtest_ar_1._0_8_ = TestBody::anon_class_1_0_00000001::__invoke;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )&actual;
        OPENSSL_lh_doall_arg
                  ((_LHASH *)
                   lh_00.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
                   .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>.
                   _M_head_impl,lh_char_call_doall_arg,&gtest_ar_1);
        std::
        __sort<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        testing::internal::
        CmpHelperEQ<std::vector<char_const*,std::allocator<char_const*>>,std::vector<char_const*,std::allocator<char_const*>>>
                  ((internal *)&gtest_ar_1,"expected","actual",
                   (vector<const_char_*,_std::allocator<const_char_*>_> *)&gtest_ar_,&actual);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&previous);
          pcVar4 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                     ,0x61,pcVar4);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&previous);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (previous != (char *)0x0) {
            (**(code **)(*(long *)previous + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                  (&actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
        std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                  ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&gtest_ar_);
      }
      iVar1 = rand();
      iVar1 = iVar1 % 3;
      _Var3._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )&actual;
      if (iVar1 == 2) {
        RandString();
        gtest_ar_1._0_8_ =
             OPENSSL_lh_delete((_LHASH *)
                               lh_00.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
                               .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>
                               ._M_head_impl,
                               actual.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_start,lh_char_call_hash_func,
                               lh_char_call_cmp_func);
        previous = Lookup(&dummy_lh,
                          (char *)actual.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        testing::internal::CmpHelperEQ<char_const*,char*>
                  ((internal *)&gtest_ar_,"Lookup(&dummy_lh, key.get())","value",&previous,
                   (char **)&gtest_ar_1);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&previous);
          pcVar4 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                     ,0x8a,pcVar4);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&previous);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (previous != (char *)0x0) {
            (**(code **)(*(long *)previous + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gtest_ar_,
                   (char *)actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_start,(allocator<char> *)&previous);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
        ::erase(&dummy_lh._M_t,(key_type *)&gtest_ar_);
        std::__cxx11::string::~string((string *)&gtest_ar_);
LAB_002cf61d:
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                   _Var3._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
      }
      else {
        if (iVar1 == 1) {
          RandString();
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          iVar1 = OPENSSL_lh_insert((_LHASH *)
                                    lh_00.
                                    super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
                                    .
                                    super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>
                                    ._M_head_impl,(void **)&gtest_ar_,(void *)gtest_ar_1._0_8_,
                                    lh_char_call_hash_func,lh_char_call_cmp_func);
          previous = (char *)gtest_ar_._0_8_;
          actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(actual.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,iVar1 != 0);
          if (iVar1 != 0) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
            actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)Lookup(&dummy_lh,(char *)gtest_ar_1._0_8_);
            testing::internal::CmpHelperEQ<char_const*,char*>
                      ((internal *)&gtest_ar_,"Lookup(&dummy_lh, key.get())","previous",
                       (char **)&actual,&previous);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&actual);
              pcVar4 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar4 = *(char **)gtest_ar_.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                         ,0x82,pcVar4);
              testing::internal::AssertHelper::operator=(&local_c0,(Message *)&actual);
              testing::internal::AssertHelper::~AssertHelper(&local_c0);
              if (actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)(*actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&gtest_ar_,(char *)gtest_ar_1._0_8_,(allocator<char> *)&actual);
            this_00 = (__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                      ::operator[](&dummy_lh,(key_type *)&gtest_ar_);
            __p = gtest_ar_1._0_8_;
            gtest_ar_1.success_ = false;
            gtest_ar_1._1_7_ = 0;
            std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset(this_00,(pointer)__p);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            _Var3._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )&gtest_ar_1;
            goto LAB_002cf61d;
          }
          testing::Message::Message((Message *)&local_c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&actual,
                     (AssertionResult *)"lh_char_insert(lh.get(), &previous, key.get())","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                     ,0x81,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&actual.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
          std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                    ((unique_ptr<char[],_std::default_delete<char[]>_> *)&gtest_ar_1);
          break;
        }
        if (iVar1 == 0) {
          RandString();
          gtest_ar_1._0_8_ =
               OPENSSL_lh_retrieve((_LHASH *)
                                   lh_00.
                                   super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
                                   .
                                   super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>
                                   ._M_head_impl,
                                   actual.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start,lh_char_call_hash_func,
                                   lh_char_call_cmp_func);
          previous = Lookup(&dummy_lh,
                            (char *)actual.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
          testing::internal::CmpHelperEQ<char_const*,char*>
                    ((internal *)&gtest_ar_,"Lookup(&dummy_lh, key.get())","value",&previous,
                     (char **)&gtest_ar_1);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&previous);
            pcVar4 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                       ,0x6f,pcVar4);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&previous);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (previous != (char *)0x0) {
              (**(code **)(*(long *)previous + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          key_hash = OPENSSL_strhash((char *)actual.
                                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
          gtest_ar_._0_8_ = TestBody::anon_class_1_0_00000001::__invoke;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )&actual;
          gtest_ar_1._0_8_ =
               OPENSSL_lh_retrieve_key
                         ((_LHASH *)
                          lh_00.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::lhash_st_char_*,_(anonymous_namespace)::FreeLHASH_OF_char>
                          .super__Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false>.
                          _M_head_impl,(key_type *)&gtest_ar_,key_hash,lh_char_call_cmp_key);
          previous = Lookup(&dummy_lh,
                            (char *)actual.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
          testing::internal::CmpHelperEQ<char_const*,char*>
                    ((internal *)&gtest_ar_,"Lookup(&dummy_lh, key.get())","value",&previous,
                     (char **)&gtest_ar_1);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&previous);
            pcVar4 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                       ,0x7a,pcVar4);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&previous);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (previous != (char *)0x0) {
              (**(code **)(*(long *)previous + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          goto LAB_002cf61d;
        }
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
    ::~_Rb_tree(&dummy_lh._M_t);
  }
  std::unique_ptr<(anonymous_namespace)::lhash_st_char,_(anonymous_namespace)::FreeLHASH_OF_char>::
  ~unique_ptr(&lh);
  return;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}